

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5GetVarint32(uchar *p,u32 *v)

{
  byte bVar1;
  uint uVar2;
  uint uStack_30;
  u8 n;
  u64 v64;
  u32 b;
  u32 a;
  u32 *v_local;
  uchar *p_local;
  
  uVar2 = (uint)*p;
  if ((*p & 0x80) == 0) {
    *v = uVar2;
    p_local._4_4_ = 1;
  }
  else {
    v64._0_4_ = (uint)p[1];
    if ((p[1] & 0x80) == 0) {
      *v = (uVar2 & 0x7f) << 7 | (uint)v64;
      p_local._4_4_ = 2;
    }
    else {
      v64._4_4_ = (uint)p[2] | uVar2 << 0xe;
      if ((p[2] & 0x80) == 0) {
        *v = v64._4_4_ & 0x1fc07f | ((uint)v64 & 0x7f) << 7;
        p_local._4_4_ = 3;
      }
      else {
        _b = v;
        v_local = (u32 *)p;
        bVar1 = sqlite3Fts5GetVarint(p,(u64 *)&uStack_30);
        *_b = uStack_30 & 0x7fffffff;
        p_local._4_4_ = (uint)bVar1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static int sqlite3Fts5GetVarint32(const unsigned char *p, u32 *v){
  u32 a,b;

  /* The 1-byte case. Overwhelmingly the most common. */
  a = *p;
  /* a: p0 (unmasked) */
  if (!(a&0x80))
  {
    /* Values between 0 and 127 */
    *v = a;
    return 1;
  }

  /* The 2-byte case */
  p++;
  b = *p;
  /* b: p1 (unmasked) */
  if (!(b&0x80))
  {
    /* Values between 128 and 16383 */
    a &= 0x7f;
    a = a<<7;
    *v = a | b;
    return 2;
  }

  /* The 3-byte case */
  p++;
  a = a<<14;
  a |= *p;
  /* a: p0<<14 | p2 (unmasked) */
  if (!(a&0x80))
  {
    /* Values between 16384 and 2097151 */
    a &= (0x7f<<14)|(0x7f);
    b &= 0x7f;
    b = b<<7;
    *v = a | b;
    return 3;
  }

  /* A 32-bit varint is used to store size information in btrees.
  ** Objects are rarely larger than 2MiB limit of a 3-byte varint.
  ** A 3-byte varint is sufficient, for example, to record the size
  ** of a 1048569-byte BLOB or string.
  **
  ** We only unroll the first 1-, 2-, and 3- byte cases.  The very
  ** rare larger cases can be handled by the slower 64-bit varint
  ** routine.
  */
  {
    u64 v64;
    u8 n;
    p -= 2;
    n = sqlite3Fts5GetVarint(p, &v64);
    *v = ((u32)v64) & 0x7FFFFFFF;
    assert( n>3 && n<=9 );
    return n;
  }
}